

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

CommandSignature __thiscall
llbuild::buildsystem::ExternalCommand::getSignature(ExternalCommand *this)

{
  pointer ppBVar1;
  CommandSignature CVar2;
  ExternalCommand *pEVar3;
  hash_code hVar4;
  CommandSignature *pCVar5;
  size_t in_RDX;
  pointer ppBVar6;
  StringRef S;
  CommandSignature local_d0;
  ExternalCommand *local_c8;
  StringRef local_c0;
  hash_combine_recursive_helper local_b0;
  
  S.Length = in_RDX;
  S.Data = (char *)(this->super_Command).name._M_string_length;
  hVar4 = llvm::hash_value((llvm *)(this->super_Command).name._M_dataplus._M_p,S);
  ppBVar6 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = this;
  if (ppBVar6 != ppBVar1) {
    do {
      local_c0.Data = ((*ppBVar6)->super_Node).name._M_dataplus._M_p;
      local_c0.Length = ((*ppBVar6)->super_Node).name._M_string_length;
      local_d0.value = hVar4.value;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer._0_8_ = hVar4.value;
      hVar4 = llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                        (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      ppBVar6 = ppBVar6 + 1;
    } while (ppBVar6 != ppBVar1);
  }
  ppBVar6 = (local_c8->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (local_c8->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.value = hVar4.value;
  if (ppBVar6 != ppBVar1) {
    do {
      CVar2.value = local_d0.value;
      local_c0.Data = ((*ppBVar6)->super_Node).name._M_dataplus._M_p;
      local_c0.Length = ((*ppBVar6)->super_Node).name._M_string_length;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer._0_8_ = CVar2.value;
      local_d0.value =
           (uint64_t)
           llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                     (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      ppBVar6 = ppBVar6 + 1;
    } while (ppBVar6 != ppBVar1);
  }
  pEVar3 = local_c8;
  pCVar5 = llbuild::basic::CommandSignature::combine(&local_d0,local_c8->allowMissingInputs);
  pCVar5 = llbuild::basic::CommandSignature::combine(pCVar5,pEVar3->allowModifiedOutputs);
  pCVar5 = llbuild::basic::CommandSignature::combine(pCVar5,pEVar3->alwaysOutOfDate);
  return (CommandSignature)pCVar5->value;
}

Assistant:

CommandSignature ExternalCommand::getSignature() const {
  CommandSignature code(getName());
  for (const auto* input: inputs) {
    code = code.combine(input->getName());
  }
  for (const auto* output: outputs) {
    code = code.combine(output->getName());
  }
  return code
      .combine(allowMissingInputs)
      .combine(allowModifiedOutputs)
      .combine(alwaysOutOfDate);
}